

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O0

void nn_req_init(nn_req *self,nn_sockbase_vfptr *vfptr,void *hint)

{
  nn_ctx *ctx;
  void *hint_local;
  nn_sockbase_vfptr *vfptr_local;
  nn_req *self_local;
  
  nn_xreq_init(&self->xreq,vfptr,hint);
  ctx = nn_sockbase_getctx((nn_sockbase *)self);
  nn_fsm_init_root(&self->fsm,nn_req_handler,nn_req_shutdown,ctx);
  self->state = 1;
  nn_random_generate(&self->lastid,4);
  (self->task).sent_to = (nn_pipe *)0x0;
  nn_msg_init(&(self->task).request,0);
  nn_msg_init(&(self->task).reply,0);
  nn_timer_init(&(self->task).timer,1,&self->fsm);
  self->resend_ivl = 60000;
  nn_task_init(&self->task,self->lastid);
  nn_fsm_start(&self->fsm);
  return;
}

Assistant:

void nn_req_init (struct nn_req *self,
    const struct nn_sockbase_vfptr *vfptr, void *hint)
{
    nn_xreq_init (&self->xreq, vfptr, hint);
    nn_fsm_init_root (&self->fsm, nn_req_handler, nn_req_shutdown,
        nn_sockbase_getctx (&self->xreq.sockbase));
    self->state = NN_REQ_STATE_IDLE;

    /*  Start assigning request IDs beginning with a random number. This way
        there should be no key clashes even if the executable is re-started. */
    nn_random_generate (&self->lastid, sizeof (self->lastid));

    self->task.sent_to = NULL;

    nn_msg_init (&self->task.request, 0);
    nn_msg_init (&self->task.reply, 0);
    nn_timer_init (&self->task.timer, NN_REQ_SRC_RESEND_TIMER, &self->fsm);
    self->resend_ivl = NN_REQ_DEFAULT_RESEND_IVL;

    nn_task_init (&self->task, self->lastid);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);
}